

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFSave<(moira::Instr)198,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  Ea<(moira::Mode)2,_2> result;
  u32 local_14;
  ushort local_10;
  
  cVar4 = 'f';
  lVar3 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = "fsave"[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  local_10 = op & 7;
  local_14 = *addr;
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_2> *)&local_14);
  return;
}

Assistant:

void
Moira::dasmFSave(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}